

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBlifMv.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkStrashBlifMv(Abc_Ntk_t *pNtk)

{
  int iVar1;
  long *plVar2;
  Abc_Ntk_t *pAVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  void *pvVar9;
  int *piVar10;
  Vec_Ptr_t *pVVar11;
  Abc_Ntk_t *pNtk_00;
  char *pcVar12;
  void *pvVar13;
  uint *puVar14;
  Abc_Obj_t *pAVar15;
  Abc_Obj_t *pAVar16;
  char *pcVar17;
  void **ppvVar18;
  Vec_Ptr_t *pVVar19;
  Abc_Obj_t *pAVar20;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  int extraout_EDX_06;
  int extraout_EDX_07;
  int extraout_EDX_08;
  int iVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  char Suffix [16];
  uint local_94;
  int local_78;
  char local_48 [24];
  
  if (pNtk->ntkType != ABC_NTK_NETLIST) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBlifMv.c"
                  ,0x18a,"Abc_Ntk_t *Abc_NtkStrashBlifMv(Abc_Ntk_t *)");
  }
  if (pNtk->ntkFunc != ABC_FUNC_BLIFMV) {
    __assert_fail("Abc_NtkHasBlifMv(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBlifMv.c"
                  ,0x18b,"Abc_Ntk_t *Abc_NtkStrashBlifMv(Abc_Ntk_t *)");
  }
  if (pNtk->nObjCounts[9] != 0) {
    __assert_fail("Abc_NtkWhiteboxNum(pNtk) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBlifMv.c"
                  ,0x18c,"Abc_Ntk_t *Abc_NtkStrashBlifMv(Abc_Ntk_t *)");
  }
  if (pNtk->nObjCounts[10] != 0) {
    __assert_fail("Abc_NtkBlackboxNum(pNtk) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBlifMv.c"
                  ,0x18d,"Abc_Ntk_t *Abc_NtkStrashBlifMv(Abc_Ntk_t *)");
  }
  pVVar11 = pNtk->vObjs;
  if (pVVar11->nSize < 1) {
    iVar8 = 2;
  }
  else {
    iVar8 = 2;
    lVar23 = 0;
    do {
      pAVar20 = (Abc_Obj_t *)pVVar11->pArray[lVar23];
      if ((pAVar20 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar20->field_0x14 & 0xf) == 6)) {
        pVVar11 = pAVar20->pNtk->vAttrs;
        if (pVVar11->nSize < 0xd) goto LAB_0083577e;
        iVar6 = 2;
        if ((pVVar11->pArray[0xc] != (void *)0x0) &&
           (pvVar9 = Abc_ObjMvVar(pAVar20), pvVar9 != (void *)0x0)) {
          piVar10 = (int *)Abc_ObjMvVar(pAVar20);
          iVar6 = *piVar10;
        }
        if (iVar8 <= iVar6) {
          iVar8 = iVar6;
        }
      }
      lVar23 = lVar23 + 1;
      pVVar11 = pNtk->vObjs;
    } while (lVar23 < pVVar11->nSize);
  }
  uVar7 = 0x1f;
  if (iVar8 - 1U != 0) {
    for (; iVar8 - 1U >> uVar7 == 0; uVar7 = uVar7 - 1) {
    }
  }
  pvVar9 = malloc((ulong)((uVar7 ^ 0x1f) * -8 + 0x100));
  Abc_NtkCleanCopy(pNtk);
  pVVar11 = Abc_NtkDfs(pNtk,0);
  pNtk_00 = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
  pcVar12 = Extra_UtilStrsav(pNtk->pName);
  pNtk_00->pName = pcVar12;
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar6 = pNtk->vObjs->nSize;
    uVar22 = (long)iVar6 + 500;
    iVar21 = (int)uVar22;
    if ((pNtk->vTravIds).nCap < iVar21) {
      piVar10 = (int *)malloc(uVar22 * 4);
      (pNtk->vTravIds).pArray = piVar10;
      if (piVar10 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vTravIds).nCap = iVar21;
    }
    if (-500 < iVar6) {
      memset((pNtk->vTravIds).pArray,0,(uVar22 & 0xffffffff) << 2);
    }
    (pNtk->vTravIds).nSize = iVar21;
  }
  iVar6 = pNtk->nTravIds;
  pNtk->nTravIds = iVar6 + 1;
  if (0x3ffffffe < iVar6) {
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                  ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  pVVar19 = pNtk->vCis;
  if (0 < pVVar19->nSize) {
    lVar23 = 0;
    do {
      plVar2 = (long *)pVVar19->pArray[lVar23];
      if ((*(uint *)((long)plVar2 + 0x14) & 0xf) == 2) {
        pAVar20 = *(Abc_Obj_t **)
                   (*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[6] * 8);
        pVVar19 = pAVar20->pNtk->vAttrs;
        if (pVVar19->nSize < 0xd) goto LAB_0083577e;
        uVar7 = 2;
        if ((pVVar19->pArray[0xc] != (void *)0x0) &&
           (pvVar13 = Abc_ObjMvVar(pAVar20), pvVar13 != (void *)0x0)) {
          puVar14 = (uint *)Abc_ObjMvVar(pAVar20);
          uVar7 = *puVar14;
        }
        pvVar13 = malloc((long)(int)uVar7 * 8);
        uVar5 = uVar7;
        if (1 < uVar7) {
          uVar5 = uVar7 - 1;
          if (uVar5 == 0) {
            uVar5 = 0;
          }
          else {
            uVar4 = 0x1f;
            if (uVar5 != 0) {
              for (; uVar5 >> uVar4 == 0; uVar4 = uVar4 - 1) {
              }
            }
            uVar5 = (uVar4 ^ 0xffffffe0) + 0x21;
          }
        }
        iVar6 = extraout_EDX;
        if (uVar5 != 0) {
          uVar22 = 0;
          do {
            pAVar15 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_PI);
            *(Abc_Obj_t **)((long)pvVar9 + uVar22 * 8) = pAVar15;
            if (iVar8 == 2) {
              pcVar12 = Abc_ObjName(pAVar20);
              Abc_ObjAssignName(pAVar15,pcVar12,(char *)0x0);
              iVar6 = extraout_EDX_00;
            }
            else {
              if (3 < (*(uint *)&pAVar15->field_0x14 & 0xe) - 2) goto LAB_0083575f;
              if ((*(uint *)&pAVar20->field_0x14 & 0xf) != 6) goto LAB_00835740;
              sprintf(local_48,"[%d]",uVar22 & 0xffffffff);
              pcVar12 = Abc_ObjName(pAVar20);
              Abc_ObjAssignName(pAVar15,pcVar12,local_48);
              iVar6 = extraout_EDX_01;
            }
            uVar22 = uVar22 + 1;
          } while (uVar5 != uVar22);
        }
        if (0 < (int)uVar7) {
          uVar22 = 0;
          do {
            pAVar15 = Abc_AigConst1(pNtk_00);
            *(Abc_Obj_t **)((long)pvVar13 + uVar22 * 8) = pAVar15;
            iVar6 = extraout_EDX_02;
            if (uVar5 != 0) {
              uVar24 = 0;
              do {
                pAVar15 = Abc_AigAnd((Abc_Aig_t *)pNtk_00->pManFunc,
                                     *(Abc_Obj_t **)((long)pvVar13 + uVar22 * 8),
                                     (Abc_Obj_t *)
                                     ((ulong)(((uint)uVar22 >> ((uint)uVar24 & 0x1f) & 1) == 0) ^
                                     *(ulong *)((long)pvVar9 + uVar24 * 8)));
                *(Abc_Obj_t **)((long)pvVar13 + uVar22 * 8) = pAVar15;
                uVar24 = uVar24 + 1;
                iVar6 = extraout_EDX_03;
              } while (uVar5 != uVar24);
            }
            uVar22 = uVar22 + 1;
          } while (uVar22 != uVar7);
        }
        (pAVar20->field_6).pTemp = pvVar13;
        pAVar3 = pAVar20->pNtk;
        iVar21 = pAVar3->nTravIds;
        iVar1 = pAVar20->Id;
        Vec_IntFillExtra(&pAVar3->vTravIds,iVar1 + 1,iVar6);
        if (((long)iVar1 < 0) || ((pAVar3->vTravIds).nSize <= iVar1)) goto LAB_0083579d;
        (pAVar3->vTravIds).pArray[iVar1] = iVar21;
      }
      lVar23 = lVar23 + 1;
      pVVar19 = pNtk->vCis;
    } while (lVar23 < pVVar19->nSize);
  }
  pVVar19 = pNtk->vCis;
  if (pVVar19->nSize < 1) {
    local_78 = 0;
  }
  else {
    lVar23 = 0;
    local_78 = 0;
    do {
      plVar2 = (long *)pVVar19->pArray[lVar23];
      if ((*(uint *)((long)plVar2 + 0x14) & 0xf) != 2) {
        pAVar20 = *(Abc_Obj_t **)
                   (*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[6] * 8);
        pVVar19 = pAVar20->pNtk->vAttrs;
        if (pVVar19->nSize < 0xd) goto LAB_0083577e;
        uVar7 = 2;
        if ((pVVar19->pArray[0xc] != (void *)0x0) &&
           (pvVar13 = Abc_ObjMvVar(pAVar20), pvVar13 != (void *)0x0)) {
          puVar14 = (uint *)Abc_ObjMvVar(pAVar20);
          uVar7 = *puVar14;
        }
        pvVar13 = malloc((long)(int)uVar7 * 8);
        uVar5 = uVar7;
        if (1 < uVar7) {
          uVar5 = uVar7 - 1;
          if (uVar5 == 0) {
            uVar5 = 0;
          }
          else {
            uVar4 = 0x1f;
            if (uVar5 != 0) {
              for (; uVar5 >> uVar4 == 0; uVar4 = uVar4 - 1) {
              }
            }
            uVar5 = (uVar4 ^ 0xffffffe0) + 0x21;
          }
        }
        iVar6 = extraout_EDX_04;
        if (uVar5 != 0) {
          local_78 = local_78 + uVar5;
          uVar22 = 0;
          do {
            pAVar15 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_BO);
            *(Abc_Obj_t **)((long)pvVar9 + uVar22 * 8) = pAVar15;
            if (iVar8 == 2) {
              pcVar12 = Abc_ObjName(pAVar20);
              Abc_ObjAssignName(pAVar15,pcVar12,(char *)0x0);
              iVar6 = extraout_EDX_05;
            }
            else {
              if (3 < (*(uint *)&pAVar15->field_0x14 & 0xe) - 2) goto LAB_0083575f;
              if ((*(uint *)&pAVar20->field_0x14 & 0xf) != 6) goto LAB_00835740;
              sprintf(local_48,"[%d]",uVar22 & 0xffffffff);
              pcVar12 = Abc_ObjName(pAVar20);
              Abc_ObjAssignName(pAVar15,pcVar12,local_48);
              iVar6 = extraout_EDX_06;
            }
            uVar22 = uVar22 + 1;
          } while (uVar5 != uVar22);
        }
        if (0 < (int)uVar7) {
          uVar22 = 0;
          do {
            pAVar15 = Abc_AigConst1(pNtk_00);
            *(Abc_Obj_t **)((long)pvVar13 + uVar22 * 8) = pAVar15;
            iVar6 = extraout_EDX_07;
            if (uVar5 != 0) {
              uVar24 = 0;
              do {
                pAVar15 = Abc_AigAnd((Abc_Aig_t *)pNtk_00->pManFunc,
                                     *(Abc_Obj_t **)((long)pvVar13 + uVar22 * 8),
                                     (Abc_Obj_t *)
                                     ((ulong)(((uint)uVar22 >> ((uint)uVar24 & 0x1f) & 1) == 0) ^
                                     *(ulong *)((long)pvVar9 + uVar24 * 8)));
                *(Abc_Obj_t **)((long)pvVar13 + uVar22 * 8) = pAVar15;
                uVar24 = uVar24 + 1;
                iVar6 = extraout_EDX_08;
              } while (uVar5 != uVar24);
            }
            uVar22 = uVar22 + 1;
          } while (uVar22 != uVar7);
        }
        (pAVar20->field_6).pTemp = pvVar13;
        pAVar3 = pAVar20->pNtk;
        iVar21 = pAVar3->nTravIds;
        iVar1 = pAVar20->Id;
        Vec_IntFillExtra(&pAVar3->vTravIds,iVar1 + 1,iVar6);
        if (((long)iVar1 < 0) || ((pAVar3->vTravIds).nSize <= iVar1)) {
LAB_0083579d:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        (pAVar3->vTravIds).pArray[iVar1] = iVar21;
      }
      lVar23 = lVar23 + 1;
      pVVar19 = pNtk->vCis;
    } while (lVar23 < pVVar19->nSize);
  }
  if (0 < pVVar11->nSize) {
    lVar23 = 0;
    do {
      iVar6 = Abc_NodeStrashBlifMv(pNtk_00,(Abc_Obj_t *)pVVar11->pArray[lVar23]);
      if (iVar6 == 0) goto LAB_00835724;
      lVar23 = lVar23 + 1;
    } while (lVar23 < pVVar11->nSize);
  }
  if (pVVar11->pArray != (void **)0x0) {
    free(pVVar11->pArray);
    pVVar11->pArray = (void **)0x0;
  }
  if (pVVar11 != (Vec_Ptr_t *)0x0) {
    free(pVVar11);
  }
  pVVar11 = pNtk->vCos;
  if (0 < pVVar11->nSize) {
    lVar23 = 0;
    do {
      plVar2 = (long *)pVVar11->pArray[lVar23];
      if ((*(uint *)((long)plVar2 + 0x14) & 0xf) == 3) {
        pAVar20 = *(Abc_Obj_t **)
                   (*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[4] * 8);
        pVVar11 = pAVar20->pNtk->vAttrs;
        if (pVVar11->nSize < 0xd) goto LAB_0083577e;
        local_94 = 2;
        if ((pVVar11->pArray[0xc] != (void *)0x0) &&
           (pvVar13 = Abc_ObjMvVar(pAVar20), pvVar13 != (void *)0x0)) {
          puVar14 = (uint *)Abc_ObjMvVar(pAVar20);
          local_94 = *puVar14;
        }
        pvVar13 = (pAVar20->field_6).pTemp;
        uVar7 = local_94;
        if (1 < local_94) {
          uVar7 = local_94 - 1;
          if (uVar7 == 0) {
            uVar7 = 0;
          }
          else {
            uVar5 = 0x1f;
            if (uVar7 != 0) {
              for (; uVar7 >> uVar5 == 0; uVar5 = uVar5 - 1) {
              }
            }
            uVar7 = (uVar5 ^ 0xffffffe0) + 0x21;
          }
        }
        if (uVar7 != 0) {
          uVar22 = 0;
          do {
            pAVar15 = Abc_AigConst1(pNtk_00);
            pAVar15 = (Abc_Obj_t *)((ulong)pAVar15 ^ 1);
            if (0 < (int)local_94) {
              uVar24 = 0;
              do {
                if ((1 << ((byte)uVar22 & 0x1f) & (uint)uVar24) != 0) {
                  pAVar15 = Abc_AigOr((Abc_Aig_t *)pNtk_00->pManFunc,pAVar15,
                                      *(Abc_Obj_t **)((long)pvVar13 + uVar24 * 8));
                }
                uVar24 = uVar24 + 1;
              } while (local_94 != uVar24);
            }
            pAVar16 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_PO);
            Abc_ObjAddFanin(pAVar16,pAVar15);
            if (iVar8 == 2) {
              pcVar17 = Abc_ObjName(pAVar20);
              pcVar12 = (char *)0x0;
            }
            else {
              if (3 < (*(uint *)&pAVar16->field_0x14 & 0xe) - 2) goto LAB_0083575f;
              if ((*(uint *)&pAVar20->field_0x14 & 0xf) != 6) goto LAB_00835740;
              pcVar12 = local_48;
              sprintf(pcVar12,"[%d]",uVar22);
              pcVar17 = Abc_ObjName(pAVar20);
            }
            Abc_ObjAssignName(pAVar16,pcVar17,pcVar12);
            uVar5 = (int)uVar22 + 1;
            uVar22 = (ulong)uVar5;
          } while (uVar5 != uVar7);
        }
      }
      lVar23 = lVar23 + 1;
      pVVar11 = pNtk->vCos;
    } while (lVar23 < pVVar11->nSize);
  }
  pVVar11 = pNtk->vCos;
  if (pVVar11->nSize < 1) {
    iVar6 = 0;
  }
  else {
    lVar23 = 0;
    iVar6 = 0;
    do {
      plVar2 = (long *)pVVar11->pArray[lVar23];
      if ((*(uint *)((long)plVar2 + 0x14) & 0xf) != 3) {
        pAVar20 = *(Abc_Obj_t **)
                   (*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[4] * 8);
        pVVar11 = pAVar20->pNtk->vAttrs;
        if (pVVar11->nSize < 0xd) goto LAB_0083577e;
        local_94 = 2;
        if ((pVVar11->pArray[0xc] != (void *)0x0) &&
           (pvVar13 = Abc_ObjMvVar(pAVar20), pvVar13 != (void *)0x0)) {
          puVar14 = (uint *)Abc_ObjMvVar(pAVar20);
          local_94 = *puVar14;
        }
        pvVar13 = (pAVar20->field_6).pTemp;
        uVar7 = local_94;
        if (1 < local_94) {
          uVar7 = local_94 - 1;
          if (uVar7 == 0) {
            uVar7 = 0;
          }
          else {
            uVar5 = 0x1f;
            if (uVar7 != 0) {
              for (; uVar7 >> uVar5 == 0; uVar5 = uVar5 - 1) {
              }
            }
            uVar7 = (uVar5 ^ 0xffffffe0) + 0x21;
          }
        }
        if (uVar7 != 0) {
          iVar6 = iVar6 + uVar7;
          uVar22 = 0;
          do {
            pAVar15 = Abc_AigConst1(pNtk_00);
            pAVar15 = (Abc_Obj_t *)((ulong)pAVar15 ^ 1);
            if (0 < (int)local_94) {
              uVar24 = 0;
              do {
                if ((1 << ((byte)uVar22 & 0x1f) & (uint)uVar24) != 0) {
                  pAVar15 = Abc_AigOr((Abc_Aig_t *)pNtk_00->pManFunc,pAVar15,
                                      *(Abc_Obj_t **)((long)pvVar13 + uVar24 * 8));
                }
                uVar24 = uVar24 + 1;
              } while (local_94 != uVar24);
            }
            pAVar16 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_BI);
            Abc_ObjAddFanin(pAVar16,pAVar15);
            if (iVar8 == 2) {
              pcVar17 = Abc_ObjName(pAVar20);
              pcVar12 = (char *)0x0;
            }
            else {
              if (3 < (*(uint *)&pAVar16->field_0x14 & 0xe) - 2) {
LAB_0083575f:
                __assert_fail("Abc_ObjIsTerm(pObj)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBlifMv.c"
                              ,0x16e,"void Abc_NtkConvertAssignName(Abc_Obj_t *, Abc_Obj_t *, int)")
                ;
              }
              if ((*(uint *)&pAVar20->field_0x14 & 0xf) != 6) {
LAB_00835740:
                __assert_fail("Abc_ObjIsNet(pNet)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBlifMv.c"
                              ,0x16f,"void Abc_NtkConvertAssignName(Abc_Obj_t *, Abc_Obj_t *, int)")
                ;
              }
              pcVar12 = local_48;
              sprintf(pcVar12,"[%d]",uVar22);
              pcVar17 = Abc_ObjName(pAVar20);
            }
            Abc_ObjAssignName(pAVar16,pcVar17,pcVar12);
            uVar5 = (int)uVar22 + 1;
            uVar22 = (ulong)uVar5;
          } while (uVar5 != uVar7);
        }
      }
      lVar23 = lVar23 + 1;
      pVVar11 = pNtk->vCos;
    } while (lVar23 < pVVar11->nSize);
  }
  if (pNtk->nObjCounts[8] != 0) {
    iVar8 = pNtk_00->vPis->nSize;
    pVVar11 = (Vec_Ptr_t *)malloc(0x10);
    iVar21 = 8;
    if (6 < iVar8 - 1U) {
      iVar21 = iVar8;
    }
    pVVar11->nSize = 0;
    pVVar11->nCap = iVar21;
    if (iVar21 == 0) {
      ppvVar18 = (void **)0x0;
    }
    else {
      ppvVar18 = (void **)malloc((long)iVar21 << 3);
    }
    pVVar11->pArray = ppvVar18;
    pVVar19 = pNtk_00->vPis;
    if (0 < pVVar19->nSize) {
      lVar23 = 0;
      do {
        pAVar20 = (Abc_Obj_t *)pVVar19->pArray[lVar23];
        pcVar12 = Abc_ObjName(pAVar20);
        iVar8 = strncmp(pcVar12,"free_var_",9);
        if (iVar8 == 0) {
          uVar7 = pVVar11->nCap;
          if (pVVar11->nSize == uVar7) {
            if ((int)uVar7 < 0x10) {
              if (pVVar11->pArray == (void **)0x0) {
                ppvVar18 = (void **)malloc(0x80);
              }
              else {
                ppvVar18 = (void **)realloc(pVVar11->pArray,0x80);
              }
              iVar8 = 0x10;
            }
            else {
              iVar8 = uVar7 * 2;
              if (iVar8 <= (int)uVar7) goto LAB_00835274;
              if (pVVar11->pArray == (void **)0x0) {
                ppvVar18 = (void **)malloc((ulong)uVar7 << 4);
              }
              else {
                ppvVar18 = (void **)realloc(pVVar11->pArray,(ulong)uVar7 << 4);
              }
            }
            pVVar11->pArray = ppvVar18;
            pVVar11->nCap = iVar8;
          }
LAB_00835274:
          iVar8 = pVVar11->nSize;
          pVVar11->nSize = iVar8 + 1;
          pVVar11->pArray[iVar8] = pAVar20;
        }
        lVar23 = lVar23 + 1;
        pVVar19 = pNtk_00->vPis;
      } while (lVar23 < pVVar19->nSize);
    }
    pVVar19 = pNtk_00->vPis;
    iVar8 = pVVar19->nSize;
    if (0 < iVar8) {
      lVar23 = 0;
      do {
        pAVar20 = (Abc_Obj_t *)pVVar19->pArray[lVar23];
        pcVar12 = Abc_ObjName(pAVar20);
        iVar8 = strncmp(pcVar12,"free_var_",9);
        if (iVar8 != 0) {
          uVar7 = pVVar11->nCap;
          if (pVVar11->nSize == uVar7) {
            if ((int)uVar7 < 0x10) {
              if (pVVar11->pArray == (void **)0x0) {
                ppvVar18 = (void **)malloc(0x80);
              }
              else {
                ppvVar18 = (void **)realloc(pVVar11->pArray,0x80);
              }
              iVar8 = 0x10;
            }
            else {
              iVar8 = uVar7 * 2;
              if (iVar8 <= (int)uVar7) goto LAB_0083534c;
              if (pVVar11->pArray == (void **)0x0) {
                ppvVar18 = (void **)malloc((ulong)uVar7 << 4);
              }
              else {
                ppvVar18 = (void **)realloc(pVVar11->pArray,(ulong)uVar7 << 4);
              }
            }
            pVVar11->pArray = ppvVar18;
            pVVar11->nCap = iVar8;
          }
LAB_0083534c:
          iVar8 = pVVar11->nSize;
          pVVar11->nSize = iVar8 + 1;
          pVVar11->pArray[iVar8] = pAVar20;
        }
        lVar23 = lVar23 + 1;
        pVVar19 = pNtk_00->vPis;
        iVar8 = pVVar19->nSize;
      } while (lVar23 < iVar8);
    }
    if (pVVar11->nSize != iVar8) {
      __assert_fail("Vec_PtrSize(vTemp) == Vec_PtrSize(pNtkNew->vPis)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBlifMv.c"
                    ,0x299,"Abc_Ntk_t *Abc_NtkStrashBlifMv(Abc_Ntk_t *)");
    }
    if (pVVar19->pArray != (void **)0x0) {
      free(pVVar19->pArray);
      pVVar19->pArray = (void **)0x0;
    }
    if (pVVar19 != (Vec_Ptr_t *)0x0) {
      free(pVVar19);
    }
    pNtk_00->vPis = pVVar11;
    iVar8 = pNtk_00->vCis->nSize;
    pVVar11 = (Vec_Ptr_t *)malloc(0x10);
    iVar21 = 8;
    if (6 < iVar8 - 1U) {
      iVar21 = iVar8;
    }
    pVVar11->nSize = 0;
    pVVar11->nCap = iVar21;
    if (iVar21 == 0) {
      ppvVar18 = (void **)0x0;
    }
    else {
      ppvVar18 = (void **)malloc((long)iVar21 << 3);
    }
    pVVar11->pArray = ppvVar18;
    pVVar19 = pNtk_00->vCis;
    if (0 < pVVar19->nSize) {
      lVar23 = 0;
      do {
        pAVar20 = (Abc_Obj_t *)pVVar19->pArray[lVar23];
        pcVar12 = Abc_ObjName(pAVar20);
        iVar8 = strncmp(pcVar12,"free_var_",9);
        if (iVar8 == 0) {
          uVar7 = pVVar11->nCap;
          if (pVVar11->nSize == uVar7) {
            if ((int)uVar7 < 0x10) {
              if (pVVar11->pArray == (void **)0x0) {
                ppvVar18 = (void **)malloc(0x80);
              }
              else {
                ppvVar18 = (void **)realloc(pVVar11->pArray,0x80);
              }
              iVar8 = 0x10;
            }
            else {
              iVar8 = uVar7 * 2;
              if (iVar8 <= (int)uVar7) goto LAB_00835498;
              if (pVVar11->pArray == (void **)0x0) {
                ppvVar18 = (void **)malloc((ulong)uVar7 << 4);
              }
              else {
                ppvVar18 = (void **)realloc(pVVar11->pArray,(ulong)uVar7 << 4);
              }
            }
            pVVar11->pArray = ppvVar18;
            pVVar11->nCap = iVar8;
          }
LAB_00835498:
          iVar8 = pVVar11->nSize;
          pVVar11->nSize = iVar8 + 1;
          pVVar11->pArray[iVar8] = pAVar20;
        }
        lVar23 = lVar23 + 1;
        pVVar19 = pNtk_00->vCis;
      } while (lVar23 < pVVar19->nSize);
    }
    pVVar19 = pNtk_00->vCis;
    iVar8 = pVVar19->nSize;
    if (0 < iVar8) {
      lVar23 = 0;
      do {
        pAVar20 = (Abc_Obj_t *)pVVar19->pArray[lVar23];
        pcVar12 = Abc_ObjName(pAVar20);
        iVar8 = strncmp(pcVar12,"free_var_",9);
        if (iVar8 != 0) {
          uVar7 = pVVar11->nCap;
          if (pVVar11->nSize == uVar7) {
            if ((int)uVar7 < 0x10) {
              if (pVVar11->pArray == (void **)0x0) {
                ppvVar18 = (void **)malloc(0x80);
              }
              else {
                ppvVar18 = (void **)realloc(pVVar11->pArray,0x80);
              }
              iVar8 = 0x10;
            }
            else {
              iVar8 = uVar7 * 2;
              if (iVar8 <= (int)uVar7) goto LAB_00835570;
              if (pVVar11->pArray == (void **)0x0) {
                ppvVar18 = (void **)malloc((ulong)uVar7 << 4);
              }
              else {
                ppvVar18 = (void **)realloc(pVVar11->pArray,(ulong)uVar7 << 4);
              }
            }
            pVVar11->pArray = ppvVar18;
            pVVar11->nCap = iVar8;
          }
LAB_00835570:
          iVar8 = pVVar11->nSize;
          pVVar11->nSize = iVar8 + 1;
          pVVar11->pArray[iVar8] = pAVar20;
        }
        lVar23 = lVar23 + 1;
        pVVar19 = pNtk_00->vCis;
        iVar8 = pVVar19->nSize;
      } while (lVar23 < iVar8);
    }
    if (pVVar11->nSize != iVar8) {
      __assert_fail("Vec_PtrSize(vTemp) == Vec_PtrSize(pNtkNew->vCis)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBlifMv.c"
                    ,0x2a4,"Abc_Ntk_t *Abc_NtkStrashBlifMv(Abc_Ntk_t *)");
    }
    if (pVVar19->pArray != (void **)0x0) {
      free(pVVar19->pArray);
      pVVar19->pArray = (void **)0x0;
    }
    if (pVVar19 != (Vec_Ptr_t *)0x0) {
      free(pVVar19);
    }
    pNtk_00->vCis = pVVar11;
    if (local_78 != iVar6) {
      __assert_fail("nCount1 == nCount2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBlifMv.c"
                    ,0x2a8,"Abc_Ntk_t *Abc_NtkStrashBlifMv(Abc_Ntk_t *)");
    }
    if (0 < local_78) {
      local_78 = -local_78;
      do {
        pAVar20 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_LATCH);
        if ((*(uint *)&pAVar20->field_0x14 & 0xf) != 8) {
          __assert_fail("Abc_ObjIsLatch(pLatch)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                        ,0x1a4,"void Abc_LatchSetInit0(Abc_Obj_t *)");
        }
        pAVar20->field_5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x1;
        pcVar12 = Abc_ObjName(pAVar20);
        Abc_ObjAssignName(pAVar20,pcVar12,(char *)0x0);
        iVar8 = pNtk_00->vCos->nSize;
        uVar7 = local_78 + iVar8;
        if (((int)uVar7 < 0) || (iVar8 <= (int)uVar7)) {
LAB_0083577e:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        iVar8 = pNtk_00->vCis->nSize;
        uVar5 = local_78 + iVar8;
        if (((int)uVar5 < 0) || (iVar8 <= (int)uVar5)) goto LAB_0083577e;
        pAVar15 = (Abc_Obj_t *)pNtk_00->vCis->pArray[uVar5];
        Abc_ObjAddFanin(pAVar20,(Abc_Obj_t *)pNtk_00->vCos->pArray[uVar7]);
        Abc_ObjAddFanin(pAVar15,pAVar20);
        local_78 = local_78 + 1;
      } while (local_78 != 0);
    }
  }
  if (pvVar9 != (void *)0x0) {
    free(pvVar9);
  }
  pVVar11 = pNtk->vObjs;
  if (0 < pVVar11->nSize) {
    lVar23 = 0;
    do {
      pvVar9 = pVVar11->pArray[lVar23];
      if ((pvVar9 != (void *)0x0) && (*(void **)((long)pvVar9 + 0x40) != (void *)0x0)) {
        free(*(void **)((long)pvVar9 + 0x40));
        *(undefined8 *)((long)pvVar9 + 0x40) = 0;
      }
      lVar23 = lVar23 + 1;
      pVVar11 = pNtk->vObjs;
    } while (lVar23 < pVVar11->nSize);
  }
  Abc_AigCleanup((Abc_Aig_t *)pNtk_00->pManFunc);
  iVar8 = Abc_NtkCheck(pNtk_00);
  if (iVar8 == 0) {
    fwrite("Abc_NtkStrashBlifMv(): Network check has failed.\n",0x31,1,_stdout);
LAB_00835724:
    Abc_NtkDelete(pNtk_00);
    pNtk_00 = (Abc_Ntk_t *)0x0;
  }
  return pNtk_00;
}

Assistant:

Abc_Ntk_t * Abc_NtkStrashBlifMv( Abc_Ntk_t * pNtk )
{
    int fUsePositional = 0;
    Vec_Ptr_t * vNodes;
    Abc_Obj_t ** pBits;
    Abc_Obj_t ** pValues;
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObj, * pTemp, * pBit, * pNet;
    int i, k, v, nValues, nValuesMax, nBits;
    int nCount1, nCount2;

    assert( Abc_NtkIsNetlist(pNtk) );
    assert( Abc_NtkHasBlifMv(pNtk) );
    assert( Abc_NtkWhiteboxNum(pNtk) == 0 );
    assert( Abc_NtkBlackboxNum(pNtk) == 0 );

    // get the largest number of values
    nValuesMax = 2;
    Abc_NtkForEachNet( pNtk, pObj, i )
    {
        nValues = Abc_ObjMvVarNum(pObj);
        if ( nValuesMax < nValues )
            nValuesMax = nValues;
    }
    nBits = Abc_Base2Log( nValuesMax );
    pBits = ABC_ALLOC( Abc_Obj_t *, nBits );

    // clean the node copy fields
    Abc_NtkCleanCopy( pNtk );
    // collect the nodes
    vNodes = Abc_NtkDfs( pNtk, 0 );

    // start the network
    pNtkNew = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    // duplicate the name and the spec
    pNtkNew->pName = Extra_UtilStrsav( pNtk->pName );
//    pNtkNew->pSpec = Extra_UtilStrsav( pNtk->pName );

    nCount1 = nCount2 = 0;
    // encode the CI nets
    Abc_NtkIncrementTravId( pNtk );
    if ( fUsePositional )
    {
        Abc_NtkForEachCi( pNtk, pObj, i )
        {
            if ( !Abc_ObjIsPi(pObj) )
                continue;
            pNet = Abc_ObjFanout0(pObj);
            nValues = Abc_ObjMvVarNum(pNet);
            pValues = ABC_ALLOC( Abc_Obj_t *, nValues );
            // create PIs for the values
            for ( v = 0; v < nValues; v++ )
            {
                pValues[v] = Abc_NtkCreatePi( pNtkNew );
                if ( nValuesMax == 2 )
                    Abc_ObjAssignName( pValues[v], Abc_ObjName(pNet), NULL );
                else
                    Abc_NtkConvertAssignName( pValues[v], pNet, v );
            }
            // save the values in the fanout net
            pNet->pCopy = (Abc_Obj_t *)pValues;
            // mark the net
            Abc_NodeSetTravIdCurrent( pNet );
        }
        Abc_NtkForEachCi( pNtk, pObj, i )
        {
            if ( Abc_ObjIsPi(pObj) )
                continue;
            pNet = Abc_ObjFanout0(pObj);
            nValues = Abc_ObjMvVarNum(pNet);
            pValues = ABC_ALLOC( Abc_Obj_t *, nValues );
            // create PIs for the values
            for ( v = 0; v < nValues; v++ )
            {
                pValues[v] = Abc_NtkCreateBo( pNtkNew );
                if ( nValuesMax == 2 )
                    Abc_ObjAssignName( pValues[v], Abc_ObjName(pNet), NULL );
                else
                    Abc_NtkConvertAssignName( pValues[v], pNet, v );
                nCount1++;
            }
            // save the values in the fanout net
            pNet->pCopy = (Abc_Obj_t *)pValues;
            // mark the net
            Abc_NodeSetTravIdCurrent( pNet );
        }
    }
    else
    {
        Abc_NtkForEachCi( pNtk, pObj, i )
        {
            if ( !Abc_ObjIsPi(pObj) )
                continue;
            pNet = Abc_ObjFanout0(pObj);
            nValues = Abc_ObjMvVarNum(pNet);
            pValues = ABC_ALLOC( Abc_Obj_t *, nValues );
            // create PIs for the encoding bits
            nBits = Abc_Base2Log( nValues );
            for ( k = 0; k < nBits; k++ )
            {
                pBits[k] = Abc_NtkCreatePi( pNtkNew );
                if ( nValuesMax == 2 )
                    Abc_ObjAssignName( pBits[k], Abc_ObjName(pNet), NULL );
                else
                    Abc_NtkConvertAssignName( pBits[k], pNet, k );
            }
            // encode the values
            for ( v = 0; v < nValues; v++ )
            {
                pValues[v] = Abc_AigConst1(pNtkNew);
                for ( k = 0; k < nBits; k++ )
                {
                    pBit = Abc_ObjNotCond( pBits[k], (v&(1<<k)) == 0 );
                    pValues[v] = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, pValues[v], pBit );
                }
            }
            // save the values in the fanout net
            pNet->pCopy = (Abc_Obj_t *)pValues;
            // mark the net
            Abc_NodeSetTravIdCurrent( pNet );
        }
        Abc_NtkForEachCi( pNtk, pObj, i )
        {
            if ( Abc_ObjIsPi(pObj) )
                continue;
            pNet = Abc_ObjFanout0(pObj);
            nValues = Abc_ObjMvVarNum(pNet);
            pValues = ABC_ALLOC( Abc_Obj_t *, nValues );
            // create PIs for the encoding bits
            nBits = Abc_Base2Log( nValues );
            for ( k = 0; k < nBits; k++ )
            {
                pBits[k] = Abc_NtkCreateBo( pNtkNew );
                if ( nValuesMax == 2 )
                    Abc_ObjAssignName( pBits[k], Abc_ObjName(pNet), NULL );
                else
                    Abc_NtkConvertAssignName( pBits[k], pNet, k );
                nCount1++;
            }
            // encode the values
            for ( v = 0; v < nValues; v++ )
            {
                pValues[v] = Abc_AigConst1(pNtkNew);
                for ( k = 0; k < nBits; k++ )
                {
                    pBit = Abc_ObjNotCond( pBits[k], (v&(1<<k)) == 0 );
                    pValues[v] = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, pValues[v], pBit );
                }
            }
            // save the values in the fanout net
            pNet->pCopy = (Abc_Obj_t *)pValues;
            // mark the net
            Abc_NodeSetTravIdCurrent( pNet );
        }
    }

    // process nodes in the topological order
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        if ( !Abc_NodeStrashBlifMv( pNtkNew, pObj ) )
        {
            Abc_NtkDelete( pNtkNew );
            return NULL;
        }
    Vec_PtrFree( vNodes );

    // encode the CO nets
    if ( fUsePositional )
    {
        Abc_NtkForEachCo( pNtk, pObj, i )
        {
            if ( !Abc_ObjIsPo(pObj) )
                continue;
            pNet = Abc_ObjFanin0(pObj);
            // skip marked nets
//            if ( Abc_NodeIsTravIdCurrent(pNet) )
//                continue;
//            Abc_NodeSetTravIdCurrent( pNet );
            nValues = Abc_ObjMvVarNum(pNet);
            pValues = (Abc_Obj_t **)pNet->pCopy;
            for ( v = 0; v < nValues; v++ )
            {
                pTemp = Abc_NtkCreatePo( pNtkNew );
                Abc_ObjAddFanin( pTemp, pValues[v] );
                if ( nValuesMax == 2 )
                    Abc_ObjAssignName( pTemp, Abc_ObjName(pNet), NULL );
                else
                    Abc_NtkConvertAssignName( pTemp, pNet, v );
            }
        }
        Abc_NtkForEachCo( pNtk, pObj, i )
        {
            if ( Abc_ObjIsPo(pObj) )
                continue;
            pNet = Abc_ObjFanin0(pObj);
            // skip marked nets
//            if ( Abc_NodeIsTravIdCurrent(pNet) )
//                continue;
//            Abc_NodeSetTravIdCurrent( pNet );
            nValues = Abc_ObjMvVarNum(pNet);
            pValues = (Abc_Obj_t **)pNet->pCopy;
            for ( v = 0; v < nValues; v++ )
            {
                pTemp = Abc_NtkCreateBi( pNtkNew );
                Abc_ObjAddFanin( pTemp, pValues[v] );
                if ( nValuesMax == 2 )
                    Abc_ObjAssignName( pTemp, Abc_ObjName(pNet), NULL );
                else
                    Abc_NtkConvertAssignName( pTemp, pNet, v );
                nCount2++;
            }
        }
    }
    else // if ( fPositional == 0 )
    {
        Abc_NtkForEachCo( pNtk, pObj, i )
        {
            if ( !Abc_ObjIsPo(pObj) )
                continue;
            pNet = Abc_ObjFanin0(pObj);
            // skip marked nets
//            if ( Abc_NodeIsTravIdCurrent(pNet) )
//                continue;
//            Abc_NodeSetTravIdCurrent( pNet );
            nValues = Abc_ObjMvVarNum(pNet);
            pValues = (Abc_Obj_t **)pNet->pCopy;
            nBits = Abc_Base2Log( nValues );
            for ( k = 0; k < nBits; k++ )
            {
                pBit = Abc_ObjNot( Abc_AigConst1(pNtkNew) );
                for ( v = 0; v < nValues; v++ )
                    if ( v & (1<<k) )
                        pBit = Abc_AigOr( (Abc_Aig_t *)pNtkNew->pManFunc, pBit, pValues[v] );
                pTemp = Abc_NtkCreatePo( pNtkNew );
                Abc_ObjAddFanin( pTemp, pBit );
                if ( nValuesMax == 2 )
                    Abc_ObjAssignName( pTemp, Abc_ObjName(pNet), NULL );
                else
                    Abc_NtkConvertAssignName( pTemp, pNet, k );
            }
        }
        Abc_NtkForEachCo( pNtk, pObj, i )
        {
            if ( Abc_ObjIsPo(pObj) )
                continue;
            pNet = Abc_ObjFanin0(pObj);
            // skip marked nets
//            if ( Abc_NodeIsTravIdCurrent(pNet) )
//                continue;
//            Abc_NodeSetTravIdCurrent( pNet );
            nValues = Abc_ObjMvVarNum(pNet);
            pValues = (Abc_Obj_t **)pNet->pCopy;
            nBits = Abc_Base2Log( nValues );
            for ( k = 0; k < nBits; k++ )
            {
                pBit = Abc_ObjNot( Abc_AigConst1(pNtkNew) );
                for ( v = 0; v < nValues; v++ )
                    if ( v & (1<<k) )
                        pBit = Abc_AigOr( (Abc_Aig_t *)pNtkNew->pManFunc, pBit, pValues[v] );
                pTemp = Abc_NtkCreateBi( pNtkNew );
                Abc_ObjAddFanin( pTemp, pBit );
                if ( nValuesMax == 2 )
                    Abc_ObjAssignName( pTemp, Abc_ObjName(pNet), NULL );
                else
                    Abc_NtkConvertAssignName( pTemp, pNet, k );
                nCount2++;
            }
        }
    }

    if ( Abc_NtkLatchNum(pNtk) )
    {
        Vec_Ptr_t * vTemp;
        Abc_Obj_t * pLatch, * pObjLi, * pObjLo;
        int i;
        // move free vars to the front among the PIs
        vTemp = Vec_PtrAlloc( Vec_PtrSize(pNtkNew->vPis) );
        Abc_NtkForEachPi( pNtkNew, pObj, i )
            if ( strncmp( Abc_ObjName(pObj), "free_var_", 9 ) == 0 )
                Vec_PtrPush( vTemp, pObj );
        Abc_NtkForEachPi( pNtkNew, pObj, i )
            if ( strncmp( Abc_ObjName(pObj), "free_var_", 9 ) != 0 )
                Vec_PtrPush( vTemp, pObj );
        assert( Vec_PtrSize(vTemp) == Vec_PtrSize(pNtkNew->vPis) );
        Vec_PtrFree( pNtkNew->vPis );
        pNtkNew->vPis = vTemp;
        // move free vars to the front among the CIs
        vTemp = Vec_PtrAlloc( Vec_PtrSize(pNtkNew->vCis) );
        Abc_NtkForEachCi( pNtkNew, pObj, i )
            if ( strncmp( Abc_ObjName(pObj), "free_var_", 9 ) == 0 )
                Vec_PtrPush( vTemp, pObj );
        Abc_NtkForEachCi( pNtkNew, pObj, i )
            if ( strncmp( Abc_ObjName(pObj), "free_var_", 9 ) != 0 )
                Vec_PtrPush( vTemp, pObj );
        assert( Vec_PtrSize(vTemp) == Vec_PtrSize(pNtkNew->vCis) );
        Vec_PtrFree( pNtkNew->vCis );
        pNtkNew->vCis = vTemp;
        // create registers
        assert( nCount1 == nCount2 );
        for ( i = 0; i < nCount1; i++ )
        {
            // create latch
            pLatch = Abc_NtkCreateLatch( pNtkNew );
            Abc_LatchSetInit0( pLatch );
            Abc_ObjAssignName( pLatch, Abc_ObjName(pLatch), NULL );
            // connect
            pObjLi = Abc_NtkCo( pNtkNew, Abc_NtkCoNum(pNtkNew)-nCount1+i );
            pObjLo = Abc_NtkCi( pNtkNew, Abc_NtkCiNum(pNtkNew)-nCount1+i );
            Abc_ObjAddFanin( pLatch, pObjLi );
            Abc_ObjAddFanin( pObjLo, pLatch );
        }
    }

    // cleanup
    ABC_FREE( pBits );
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( pObj->pCopy )
            ABC_FREE( pObj->pCopy );

    // remove dangling nodes
    i = Abc_AigCleanup((Abc_Aig_t *)pNtkNew->pManFunc);
//    printf( "Cleanup removed %d nodes.\n", i );
//    Abc_NtkReassignIds( pNtkNew );

    // check integrity
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        fprintf( stdout, "Abc_NtkStrashBlifMv(): Network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}